

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O3

int equal_fare_attributes(fare_attributes_t *a,fare_attributes_t *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(a->fare_id,b->fare_id);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->currency_type,b->currency_type);
    uVar3 = uVar2;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->agency_id,b->agency_id);
      if ((((iVar1 == 0) && (a->price == b->price)) && (!NAN(a->price) && !NAN(b->price))) &&
         ((a->payment_method == b->payment_method && (a->transfers == b->transfers)))) {
        uVar3 = -(uint)(b->transfer_duration == a->transfer_duration) & 1;
      }
    }
  }
  return uVar3;
}

Assistant:

int equal_fare_attributes(const fare_attributes_t *a, const fare_attributes_t *b) {
    return (!strcmp(a->fare_id, b->fare_id) &&
             !strcmp(a->currency_type, b->currency_type) &&
             !strcmp(a->agency_id, b->agency_id) &&
             a->price == b->price &&
             a->payment_method == b->payment_method &&
             a->transfers == b->transfers &&
             a->transfer_duration == b->transfer_duration);
}